

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O1

void iutest::Test::RecordProperty<char_const*>(string *key,char **value)

{
  char **in_RDX;
  string local_70;
  TestProperty local_50;
  
  PrintToString<char_const*>(&local_70,(iutest *)value,in_RDX);
  TestProperty::TestProperty(&local_50,key,&local_70);
  UnitTestImpl::RecordProperty(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_value._M_dataplus._M_p != &local_50.m_value.field_2) {
    operator_delete(local_50.m_value._M_dataplus._M_p,
                    local_50.m_value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_key._M_dataplus._M_p != &local_50.m_key.field_2) {
    operator_delete(local_50.m_key._M_dataplus._M_p,local_50.m_key.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }